

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void fts3EvalTokenCosts(Fts3Cursor *pCsr,Fts3Expr *pRoot,Fts3Expr *pExpr,Fts3TokenAndCost **ppTC,
                       Fts3Expr ***ppOr,int *pRc)

{
  int iVar1;
  Fts3SegReader *pFVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  Fts3MultiSegReader *pFVar6;
  long lVar7;
  Fts3TokenAndCost *pFVar8;
  Fts3Expr ***pnLoad;
  long iBlockid;
  int local_6c;
  Fts3TokenAndCost *local_68;
  Fts3MultiSegReader *local_60;
  Fts3Cursor *local_58;
  Fts3PhraseToken *local_50;
  Fts3Phrase *local_48;
  long local_40;
  Fts3Table *local_38;
  
  pnLoad = ppOr;
  if (*pRc != 0) {
    return;
  }
  do {
    iVar4 = pExpr->eType;
    if (iVar4 == 4) {
      pRoot = pExpr->pLeft;
      **ppOr = pRoot;
      *ppOr = *ppOr + 1;
    }
    else {
      if (iVar4 == 2) {
        return;
      }
      if (iVar4 == 5) {
        local_48 = pExpr->pPhrase;
        if (local_48->nToken < 1) {
          return;
        }
        local_50 = local_48->aToken;
        local_40 = 0;
        local_58 = pCsr;
        do {
          pFVar8 = *ppTC;
          *ppTC = pFVar8 + 1;
          pFVar8->pPhrase = local_48;
          pFVar8->iToken = (int)local_40;
          pFVar8->pRoot = pRoot;
          pFVar8->pToken = local_50 + local_40;
          pFVar8->iCol = local_48->iColumn;
          pFVar6 = local_50[local_40].pSegcsr;
          iVar4 = pFVar6->nSegment;
          iVar5 = 0;
          if (0 < iVar4) {
            local_38 = (Fts3Table *)(local_58->base).pVtab;
            iVar1 = local_38->nPgsz;
            iVar5 = 0;
            lVar7 = 0;
            local_68 = pFVar8;
            local_60 = pFVar6;
            do {
              pFVar2 = pFVar6->apSegment[lVar7];
              if (((pFVar2->ppNextElem == (Fts3HashElem **)0x0) && (pFVar2->rootOnly == '\0')) &&
                 (pFVar6 = local_60, iBlockid = pFVar2->iStartBlock,
                 pFVar2->iStartBlock <= pFVar2->iLeafEndBlock)) {
                do {
                  iVar4 = sqlite3Fts3ReadBlock
                                    (local_38,iBlockid,(char **)0x0,&local_6c,(int *)pnLoad);
                  if (iVar4 != 0) {
                    local_68->nOvfl = iVar5;
                    *pRc = iVar4;
                    return;
                  }
                  if (iVar1 < local_6c + 0x23) {
                    iVar5 = iVar5 + (local_6c + 0x22) / iVar1;
                  }
                  bVar3 = iBlockid < pFVar2->iLeafEndBlock;
                  iBlockid = iBlockid + 1;
                } while (bVar3);
                iVar4 = local_60->nSegment;
                pFVar6 = local_60;
                pFVar8 = local_68;
              }
              lVar7 = lVar7 + 1;
            } while (lVar7 < iVar4);
          }
          pFVar8->nOvfl = iVar5;
          *pRc = 0;
          local_40 = local_40 + 1;
        } while (local_40 < local_48->nToken);
        return;
      }
    }
    pnLoad = ppOr;
    fts3EvalTokenCosts(pCsr,pRoot,pExpr->pLeft,ppTC,ppOr,pRc);
    if (pExpr->eType == 4) {
      pRoot = pExpr->pRight;
      **ppOr = pRoot;
      *ppOr = *ppOr + 1;
    }
    pExpr = pExpr->pRight;
    if (*pRc != 0) {
      return;
    }
  } while( true );
}

Assistant:

static void fts3EvalTokenCosts(
  Fts3Cursor *pCsr,               /* FTS Cursor handle */
  Fts3Expr *pRoot,                /* Root of current AND/NEAR cluster */
  Fts3Expr *pExpr,                /* Expression to consider */
  Fts3TokenAndCost **ppTC,        /* Write new entries to *(*ppTC)++ */
  Fts3Expr ***ppOr,               /* Write new OR root to *(*ppOr)++ */
  int *pRc                        /* IN/OUT: Error code */
){
  if( *pRc==SQLITE_OK ){
    if( pExpr->eType==FTSQUERY_PHRASE ){
      Fts3Phrase *pPhrase = pExpr->pPhrase;
      int i;
      for(i=0; *pRc==SQLITE_OK && i<pPhrase->nToken; i++){
        Fts3TokenAndCost *pTC = (*ppTC)++;
        pTC->pPhrase = pPhrase;
        pTC->iToken = i;
        pTC->pRoot = pRoot;
        pTC->pToken = &pPhrase->aToken[i];
        pTC->iCol = pPhrase->iColumn;
        *pRc = sqlite3Fts3MsrOvfl(pCsr, pTC->pToken->pSegcsr, &pTC->nOvfl);
      }
    }else if( pExpr->eType!=FTSQUERY_NOT ){
      assert( pExpr->eType==FTSQUERY_OR
           || pExpr->eType==FTSQUERY_AND
           || pExpr->eType==FTSQUERY_NEAR
      );
      assert( pExpr->pLeft && pExpr->pRight );
      if( pExpr->eType==FTSQUERY_OR ){
        pRoot = pExpr->pLeft;
        **ppOr = pRoot;
        (*ppOr)++;
      }
      fts3EvalTokenCosts(pCsr, pRoot, pExpr->pLeft, ppTC, ppOr, pRc);
      if( pExpr->eType==FTSQUERY_OR ){
        pRoot = pExpr->pRight;
        **ppOr = pRoot;
        (*ppOr)++;
      }
      fts3EvalTokenCosts(pCsr, pRoot, pExpr->pRight, ppTC, ppOr, pRc);
    }
  }
}